

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow_tests.cpp
# Opt level: O1

void __thiscall pow_tests::get_next_work::test_method(get_next_work *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar5;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  uint local_1a4;
  undefined1 local_1a0 [16];
  undefined1 *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  uint expected_nbits;
  unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_> chainParams;
  undefined8 local_150;
  assertion_result local_148;
  undefined8 *local_130;
  uint *local_128;
  lazy_ostream local_120;
  undefined1 *local_110;
  uint **local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  CBlockIndex pindexLast;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CreateChainParams((ArgsManager *)&chainParams,
                    (ChainType)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  pindexLast.pskip = (CBlockIndex *)0x0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[6] = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[7] = 0;
  pindexLast.nTx = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[2] = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[3] = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[4] = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[5] = 0;
  pindexLast.nDataPos = 0;
  pindexLast.nUndoPos = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[0] = 0;
  pindexLast.nChainWork.super_base_uint<256U>.pn[1] = 0;
  pindexLast.phashBlock = (uint256 *)0x0;
  pindexLast.pprev = (CBlockIndex *)0x0;
  pindexLast.nNonce = 0;
  pindexLast.nSequenceId = 0;
  pindexLast.m_chain_tx_count = 0;
  pindexLast.nStatus = 0;
  pindexLast.nVersion = 0;
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  pindexLast.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  pindexLast.nTimeMax = 0;
  pindexLast.nHeight = 0x7dff;
  pindexLast.nFile = 0;
  pindexLast.nTime = 0x4b3aec23;
  pindexLast.nBits = 0x1d00ffff;
  expected_nbits = 0x1d00d86a;
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1f;
  file.m_begin = (iterator)&local_170;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_180,msg);
  local_1a0._8_8_ = local_1a0._8_8_ & 0xffffffffffffff00;
  local_1a0._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_188 = "";
  local_1a4 = CalculateNextWorkRequired
                        (&pindexLast,0x4b2b51b1,
                         (Params *)
                         chainParams._M_t.
                         super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                         .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl);
  local_128 = &local_1a4;
  local_150 = &expected_nbits;
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a4 == expected_nbits);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_f8 = "";
  local_108 = &local_128;
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3d30;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_130 = &local_150;
  local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
  local_148._0_8_ = &PTR__lazy_ostream_013d3d30;
  local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_1a0,1,2,REQUIRE,0xee6cbb,(size_t)&local_100,0x1f,
             &local_120,"expected_nbits",&local_148);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x20;
  file_00.m_begin = (iterator)&local_1b8;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c8,
             msg_00);
  _cVar5 = 0x5218b3;
  bVar2 = PermittedDifficultyTransition
                    ((Params *)
                     chainParams._M_t.
                     super___uniq_ptr_impl<const_CChainParams,_std::default_delete<const_CChainParams>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_CChainParams_*,_std::default_delete<const_CChainParams>_>
                     .super__Head_base<0UL,_const_CChainParams_*,_false>._M_head_impl,
                     (long)pindexLast.nHeight + 1,pindexLast.nBits,expected_nbits);
  local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_148.m_message.px = (element_type *)0x0;
  local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1a0._0_8_ =
       "PermittedDifficultyTransition(chainParams->GetConsensus(), pindexLast.nHeight+1, pindexLast.nBits, expected_nbits)"
  ;
  local_1a0._8_8_ = "";
  local_120.m_empty = false;
  local_120._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = (uint **)local_1a0;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/pow_tests.cpp";
  local_1d0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_148,&local_120,1,0,WARN,_cVar5,(size_t)&local_1d8,0x20);
  boost::detail::shared_count::~shared_count((shared_count *)((long)&local_148 + 0x10));
  std::unique_ptr<const_CChainParams,_std::default_delete<const_CChainParams>_>::~unique_ptr
            (&chainParams);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(get_next_work)
{
    const auto chainParams = CreateChainParams(*m_node.args, ChainType::MAIN);
    int64_t nLastRetargetTime = 1261130161; // Block #30240
    CBlockIndex pindexLast;
    pindexLast.nHeight = 32255;
    pindexLast.nTime = 1262152739;  // Block #32255
    pindexLast.nBits = 0x1d00ffff;

    // Here (and below): expected_nbits is calculated in
    // CalculateNextWorkRequired(); redoing the calculation here would be just
    // reimplementing the same code that is written in pow.cpp. Rather than
    // copy that code, we just hardcode the expected result.
    unsigned int expected_nbits = 0x1d00d86aU;
    BOOST_CHECK_EQUAL(CalculateNextWorkRequired(&pindexLast, nLastRetargetTime, chainParams->GetConsensus()), expected_nbits);
    BOOST_CHECK(PermittedDifficultyTransition(chainParams->GetConsensus(), pindexLast.nHeight+1, pindexLast.nBits, expected_nbits));
}